

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirEMPTYTRD(void)

{
  char cVar1;
  bool bVar2;
  size_t __n;
  char diskLabel [9];
  string srcLabel;
  path fnaam;
  char local_60 [16];
  string local_50;
  path local_30;
  
  if (pass == 3) {
    builtin_strncpy(local_60,"        ",9);
    GetOutputFileName_abi_cxx11_(&local_30,&lp);
    cVar1 = std::filesystem::__cxx11::path::has_filename();
    if (cVar1 == '\0') {
      Error("[EMPTYTRD] Syntax error",bp,IF_FIRST);
    }
    else {
      bVar2 = anyComma(&lp);
      if (bVar2) {
        GetDelimitedString_abi_cxx11_(&local_50,&lp);
        if (local_50._M_string_length == 0) {
          Error("[EMPTYTRD] Syntax error, empty label",bp,IF_FIRST);
        }
        else {
          __n = 8;
          if (local_50._M_string_length < 8) {
            __n = local_50._M_string_length;
          }
          memcpy(local_60,local_50._M_dataplus._M_p,__n);
          if (8 < local_50._M_string_length) {
            Warning("[EMPTYTRD] label will be truncated to 8 characters",local_60,W_PASS3);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      TRD_SaveEmpty(&local_30,local_60);
    }
    std::filesystem::__cxx11::path::~path(&local_30);
    return;
  }
  SkipToEol(&lp);
  return;
}

Assistant:

static void dirEMPTYTRD() {
	if (pass != LASTPASS) {
		SkipToEol(lp);
		return;
	}
	char diskLabel[9] = "        ";

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	if (!fnaam.has_filename()) {
		Error("[EMPTYTRD] Syntax error", bp, IF_FIRST);
		return;
	}
	if (anyComma(lp)) {
		const std::string srcLabel = GetDelimitedString(lp);
		if (srcLabel.empty()) {
			Error("[EMPTYTRD] Syntax error, empty label", bp, IF_FIRST);
		} else {
			memcpy(diskLabel, srcLabel.data(), std::min(static_cast<std::string::size_type>(8), srcLabel.size()));
			if (8 < srcLabel.size()) {
				Warning("[EMPTYTRD] label will be truncated to 8 characters", diskLabel);
			}
		}
	}
	TRD_SaveEmpty(fnaam, diskLabel);
}